

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

size_t __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,size_t pageToDecommit)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint pageCount;
  uint uVar8;
  BVIndex i;
  BVIndex BVar9;
  undefined8 *in_FS_OFFSET;
  
  if (pageToDecommit == 0) {
LAB_0027c32d:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x250,"(pageToDecommit != 0 && this->GetAvailablePageCount() > 0)",
                       "pageToDecommit != 0 && this->GetAvailablePageCount() > 0");
    if (!bVar3) goto LAB_0027c485;
    *puVar1 = 0;
  }
  else {
    uVar5 = GetAvailablePageCount(this);
    if (uVar5 == 0) goto LAB_0027c32d;
  }
  uVar8 = 0;
  uVar5 = 0;
  BVar9 = 0;
  do {
    i = BVar9;
    BVar4 = BVStatic<272UL>::Test(&this->freePages,i);
    if (BVar4 == '\0') {
      if (uVar5 <= i && i - uVar5 != 0) {
        DecommitFreePagesInternal(this,uVar5,i - uVar5);
      }
      uVar5 = i + 1;
    }
    else {
      uVar8 = uVar8 + 1;
    }
    BVar9 = i + 1;
    uVar6 = GetAvailablePageCount(this);
  } while ((BVar9 < uVar6) && (uVar8 < pageToDecommit));
  if (uVar5 <= i) {
    DecommitFreePagesInternal(this,uVar5,BVar9 - uVar5);
  }
  uVar7 = this->freePageCount;
  if (uVar7 < uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x26b,"(decommitCount <= this->freePageCount)",
                       "decommitCount <= this->freePageCount");
    if (!bVar3) {
LAB_0027c485:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    uVar7 = this->freePageCount;
  }
  this->decommitPageCount = this->decommitPageCount + uVar8;
  this->freePageCount = uVar7 - uVar8;
  return (ulong)uVar8;
}

Assistant:

size_t
PageSegmentBase<T>::DecommitFreePages(size_t pageToDecommit)
{
    Assert(pageToDecommit != 0 && this->GetAvailablePageCount() > 0);

    uint startIndex = 0, index = 0, decommitCount = 0;
    do
    {
        if (!this->TestInFreePagesBitVector(index))
        {
            if (startIndex < index)
            {
                uint pageCount = index - startIndex;
                this->DecommitFreePagesInternal(startIndex, pageCount);
            }
            startIndex = index + 1;
        }
        else
        {
            decommitCount++;
        }
    }
    while (++index < this->GetAvailablePageCount() && decommitCount < pageToDecommit);

    if (startIndex < index)
    {
        uint pageCount = index - startIndex;
        this->DecommitFreePagesInternal(startIndex, pageCount);
    }

    Assert(decommitCount <= this->freePageCount);
    this->decommitPageCount += decommitCount;
    this->freePageCount -= decommitCount;
    return decommitCount;
}